

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsm.hpp
# Opt level: O0

void remora::bindings::
     trsm_recursive<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::triangular_tag<false,false>>
               (undefined8 param_1,
               matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
               *param_2,long param_3,undefined8 param_4)

{
  dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag> *this;
  size_type sVar1;
  long lVar2;
  type Bback;
  type Bfront;
  size_t split;
  size_t numBlocks;
  size_t size;
  type B;
  type A;
  size_t num_rhs;
  value_type in_stack_fffffffffffffef8;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff00;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff08;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff20;
  undefined1 local_70 [32];
  dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag> local_50
  ;
  size_type local_30;
  undefined8 local_28;
  long local_20;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_18;
  undefined8 local_10;
  
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  this = matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
         ::operator()(param_2);
  local_30 = dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
             ::size2(this);
  subrange<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
             (size_t)in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
  subrange<remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
            ((matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (size_t)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
             (size_t)in_stack_ffffffffffffff00);
  sVar1 = dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
          ::size1(&local_50);
  if (sVar1 < 0x21) {
    trsm_block<32ul,16ul,false,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>>
              (&local_50,local_70);
  }
  else {
    dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>::size1
              (&local_50);
    sVar1 = dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
            ::size1(&local_50);
    lVar2 = (sVar1 + 0x1f >> 6) * 0x20;
    subrange<remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
              ((matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (size_t)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
               (size_t)in_stack_ffffffffffffff00);
    subrange<remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
              ((matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (size_t)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
               (size_t)in_stack_ffffffffffffff00);
    trsm_recursive<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::triangular_tag<false,false>>
              (local_10,local_18,local_20,local_20 + lVar2);
    subrange<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10
               ,(size_t)in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
    kernels::
    gemm<remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8);
    trsm_recursive<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::triangular_tag<false,false>>
              (local_10,local_18,local_20 + lVar2,local_28);
  }
  return;
}

Assistant:

void trsm_recursive(
	matrix_expression<MatA, cpu_tag> const& Afull,
	matrix_expression<MatB, cpu_tag> & Bfull,
	std::size_t start,
	std::size_t end,
	Triangular t,
	left l
){
	static std::size_t const Block_Size =  32;
	std::size_t num_rhs = Bfull().size2();
	auto A = subrange(Afull,start,end,start,end);
	auto B = subrange(Bfull,start,end,0,num_rhs);
	//if the matrix is small enough call the computation kernel directly for the block
	if(A.size1() <= Block_Size){
		trsm_block<Block_Size,16,Triangular::is_unit>(A,B,triangular_tag<Triangular::is_upper,false>(), typename MatB::orientation());
		return;
	}
	std::size_t size = A.size1();
	std::size_t numBlocks =(A.size1()+Block_Size-1)/Block_Size;
	std::size_t split = numBlocks/2*Block_Size;
	auto Bfront = subrange(B,0,split,0,num_rhs);
	auto Bback = subrange(B,split,size,0,num_rhs);

	//otherwise run the kernel recursively
	if(Triangular::is_upper){ //Upper triangular case
		trsm_recursive(Afull, Bfull,start+split,end, t, l);
		kernels::gemm(subrange(A,0,split,split,size), Bback, Bfront, -1.0);
		trsm_recursive(Afull, Bfull,start,start+split, t, l);
	}else{// Lower triangular caste
		trsm_recursive(Afull, Bfull,start,start+split, t, l);
		kernels::gemm(subrange(A,split,size,0,split), Bfront, Bback, -1.0);
		trsm_recursive(Afull, Bfull,start+split,end, t, l);
	}
}